

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O3

string * __thiscall
program_options::error_with_option_name::get_canonical_option_prefix_abi_cxx11_
          (string *__return_storage_ptr__,error_with_option_name *this)

{
  logic_error *this_00;
  char *pcVar1;
  char *pcVar2;
  
  switch(this->m_option_style) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "";
    pcVar2 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "--";
    pcVar1 = "";
    break;
  case 2:
  case 3:
  case 5:
  case 6:
  case 7:
switchD_00152ce8_caseD_2:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "error_with_option_name::m_option_style can only be one of [0, allow_dash_for_short, allow_slash_for_short, allow_long_disguise or allow_long]"
              );
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "/";
    pcVar1 = "";
    break;
  default:
    if (this->m_option_style != 0x1000) goto switchD_00152ce8_caseD_2;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "-";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string error_with_option_name::get_canonical_option_prefix() const
{
    switch (m_option_style)
    {
    case command_line_style::allow_dash_for_short:
        return "-";
    case command_line_style::allow_slash_for_short:
        return "/";
    case command_line_style::allow_long_disguise:
        return "-";
    case command_line_style::allow_long:
        return "--";
    case 0:
        return "";
    }
    throw std::logic_error("error_with_option_name::m_option_style can only be "
                           "one of [0, allow_dash_for_short, allow_slash_for_short, "
                           "allow_long_disguise or allow_long]");
}